

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

int * __thiscall
TMap<int,_int,_THashTraits<int>,_InitIntToZero>::Insert
          (TMap<int,_int,_THashTraits<int>,_InitIntToZero> *this,int key,int *value)

{
  Node *pNVar1;
  Node *pNVar2;
  
  pNVar1 = this->Nodes + (this->Size - 1 & key);
  while ((pNVar2 = pNVar1, pNVar2 != (Node *)0x0 && (pNVar2->Next != (Node *)0x1))) {
    pNVar1 = pNVar2->Next;
    if ((pNVar2->Pair).Key == key) {
LAB_004e7150:
      if (pNVar2 == (Node *)0x0) {
        pNVar2 = NewKey(this,key);
      }
      (pNVar2->Pair).Value = *value;
      return &(pNVar2->Pair).Value;
    }
  }
  pNVar2 = (Node *)0x0;
  goto LAB_004e7150;
}

Assistant:

VT &Insert(const KT key, const VT &value)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			n->Pair.Value = value;
		}
		else
		{
			n = NewKey(key);
			::new(&n->Pair.Value) VT(value);
		}
		return n->Pair.Value;
	}